

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O0

void RegisterOutputScriptRPCCommands(CRPCTable *t)

{
  int iVar1;
  long in_FS_OFFSET;
  CRPCCommand *c;
  CRPCCommand *__end1;
  CRPCCommand *__begin1;
  CRPCCommand (*__range1) [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  CRPCTable *in_stack_ffffffffffffff08;
  CRPCCommand *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string *category;
  allocator<char> *in_stack_ffffffffffffff38;
  CRPCCommand *pCVar2;
  char *in_stack_ffffffffffffff40;
  CRPCCommand *pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  allocator<char> local_8c;
  CRPCCommand local_8b;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterOutputScriptRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterOutputScriptRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      pCVar3 = (CRPCCommand *)((long)&local_8b.category._M_dataplus._M_p + 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      CRPCCommand::CRPCCommand
                (pCVar3,in_stack_ffffffffffffff20,(RpcMethodFnType)in_stack_ffffffffffffff18);
      category = (string *)((long)&local_8b + 1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      CRPCCommand::CRPCCommand(pCVar3,category,(RpcMethodFnType)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff18 = &local_8b;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      CRPCCommand::CRPCCommand(pCVar3,category,(RpcMethodFnType)in_stack_ffffffffffffff18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      CRPCCommand::CRPCCommand(pCVar3,category,(RpcMethodFnType)in_stack_ffffffffffffff18);
      std::__cxx11::string::~string(in_stack_fffffffffffffef8);
      std::allocator<char>::~allocator(&local_8c);
      std::__cxx11::string::~string(in_stack_fffffffffffffef8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8b);
      std::__cxx11::string::~string(in_stack_fffffffffffffef8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&local_8b + 1));
      std::__cxx11::string::~string(in_stack_fffffffffffffef8);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&local_8b.category._M_dataplus._M_p + 2));
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterOutputScriptRPCCommands(CRPCTable&)::commands);
    }
  }
  pCVar2 = (CRPCCommand *)&RegisterOutputScriptRPCCommands(CRPCTable&)::commands;
  for (pCVar3 = RegisterOutputScriptRPCCommands::commands; pCVar3 != pCVar2; pCVar3 = pCVar3 + 1) {
    CRPCTable::appendCommand
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_ffffffffffffff18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterOutputScriptRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"util", &validateaddress},
        {"util", &createmultisig},
        {"util", &deriveaddresses},
        {"util", &getdescriptorinfo},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}